

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O0

Status pack(Header *header,FILE *ifp,FILE *ofp)

{
  Byte BVar1;
  Ferror FVar2;
  int local_34;
  Byte local_2d;
  int bytecount;
  Byte byte;
  Byte prevbyte;
  Word len;
  FILE *ofp_local;
  FILE *ifp_local;
  Header *header_local;
  
  bytecount = header->origlen;
  init_garble();
  complen = 0;
  crc = 0;
  local_2d = read_byte(ifp);
  local_34 = 1;
  do {
    bytecount = bytecount - 1;
    if (bytecount == 0) break;
    BVar1 = read_byte(ifp);
    if (local_2d == 0x90) {
      write_ncr(ofp,0x90,1);
      local_34 = 1;
    }
    else if ((BVar1 == local_2d) && (local_34 < 0xfe)) {
      local_34 = local_34 + 1;
    }
    else {
      write_ncr(ofp,local_2d,local_34);
      local_34 = 1;
    }
    FVar2 = check_stream(ifp);
    local_2d = BVar1;
  } while (FVar2 == FNOERR);
  write_ncr(ofp,local_2d,local_34);
  FVar2 = check_stream(ifp);
  if (FVar2 == FRWERR) {
    header_local._4_4_ = RERR;
  }
  else if ((testing == '\0') && (FVar2 = check_stream(ofp), FVar2 == FRWERR)) {
    header_local._4_4_ = WERR;
  }
  else {
    if (testing == '\0') {
      msg("packed");
    }
    else {
      msg("OK (packed)");
    }
    header->crc = (Halfword)crc;
    header->complen = complen;
    header_local._4_4_ = NOERR;
  }
  return header_local._4_4_;
}

Assistant:

Status
pack(Header *header, FILE *ifp, FILE *ofp)
{
	register Word len = header->origlen;
	Byte prevbyte = '\0', byte;
	int bytecount = 0;

    init_garble();

	complen = 0;
	crc = 0;
	prevbyte = read_byte(ifp);
	len--;
	bytecount = 1;
	while (len--)
	{
		byte = read_byte(ifp);
		if(prevbyte == RUNMARK)
		{
			write_ncr(ofp, prevbyte, 1);
			bytecount = 1;
		}
		else if (byte == prevbyte && bytecount < 254)
		{
			bytecount++;
		}
		else
		{
			write_ncr(ofp, prevbyte, bytecount);
			bytecount = 1;
		}
		prevbyte = byte;
		if (check_stream(ifp) != FNOERR)
			break;
	}
	write_ncr(ofp, prevbyte, bytecount);

	if (check_stream(ifp) == FRWERR)
		return (RERR);
	if (!testing && check_stream(ofp) == FRWERR)
		return (WERR);
	if (testing)
		msg("OK (packed)");
	else
		msg("packed");

	header->crc = (Halfword) crc;
	header->complen = complen;

	return (NOERR);
}